

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O3

void __thiscall MDIOAnalyzer::WorkerThread(MDIOAnalyzer *this)

{
  MDIOAnalyzerResults *pMVar1;
  AnalyzerChannelData *pAVar2;
  U32 UVar3;
  MarkerType MVar4;
  
  UVar3 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar3;
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mMdio = pAVar2;
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mMdc = pAVar2;
  do {
    AdvanceToHighMDIO(this);
    AdvanceToStartFrame(this);
    pMVar1 = (this->mResults)._M_ptr;
    MVar4 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker((ulonglong)pMVar1,MVar4,(Channel *)0x8);
    ProcessStartFrame(this);
    ProcessOpcodeFrame(this);
    ProcessPhyAddrFrame(this);
    ProcessRegAddrDevTypeFrame(this);
    ProcessTAFrame(this);
    ProcessAddrDataFrame(this);
    pMVar1 = (this->mResults)._M_ptr;
    MVar4 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker((ulonglong)pMVar1,MVar4,(Channel *)0x9);
    AddArrowMarkers(this);
    AnalyzerResults::CommitPacketAndStartNewPacket();
    AnalyzerResults::CommitResults();
  } while( true );
}

Assistant:

void MDIOAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();
    // mPacketInTransaction = 0;
    // mTransactionID = 0;

    // mMDio and mMdc have the actual data from the channel
    mMdio = GetAnalyzerChannelData( mSettings->mMdioChannel );
    mMdc = GetAnalyzerChannelData( mSettings->mMdcChannel );

    for( ;; )
    {
        // normally pulled up
        AdvanceToHighMDIO();

        // go to the beggining of a start frame (MDIO HIGH->LOW transition)
        AdvanceToStartFrame();

        // Put a marker in the start position
        mResults->AddMarker( mMdio->GetSampleNumber(), AnalyzerResults::Start, mSettings->mMdioChannel );

        // process the packet
        ProcessStartFrame();
        ProcessOpcodeFrame();
        ProcessPhyAddrFrame();
        ProcessRegAddrDevTypeFrame();
        ProcessTAFrame();
        ProcessAddrDataFrame();

        // Put a marker in the end of the packet
        mResults->AddMarker( mMdio->GetSampleNumber(), AnalyzerResults::Stop, mSettings->mMdioChannel );

        AddArrowMarkers();

        // commit the generated frames to a packet
        U64 packet_id = mResults->CommitPacketAndStartNewPacket();

        // NOTE: For future support of transactions in MDIOAnalyzer class
        // add the current packet to the current transaction
        // mResults->AddPacketToTransaction( mTransactionID, packet_id );

        // finally commit the results to the MDIOAnalyzerResults class
        mResults->CommitResults();

        // NOTE: For future support of transactions in MDIOAnalyzer class
        // Check if it is the end of a C22 or C45 transaction (C45 transaction consists of two frames)
        /*
        if( ( mCurrentPacket.clause == MDIO_C22_PACKET ) ||
            ( mCurrentPacket.clause == MDIO_C45_PACKET && mPacketInTransaction == 2 ) )
        {
            mTransactionID++;
            mPacketInTransaction = 0;
        }
        */
    }
}